

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O1

LY_ERR lyd_diff_merge_none(lyd_node *diff_match,lyd_diff_op cur_op,lyd_node *src_diff)

{
  ly_ctx *ctx;
  uint uVar1;
  char *__ptr;
  char *pcVar2;
  lys_module *plVar3;
  LY_ERR LVar4;
  
  if ((cur_op < 4) && (cur_op != LYD_DIFF_OP_DELETE)) {
    LVar4 = LY_SUCCESS;
    if ((src_diff->schema->nodetype & 0xc) != 0) {
      uVar1 = diff_match->flags & 0xfffffffe;
      diff_match->flags = uVar1;
      diff_match->flags = src_diff->flags & 1 | uVar1;
      LVar4 = LY_SUCCESS;
    }
  }
  else {
    __ptr = lyd_path(diff_match,LYD_PATH_STD,(char *)0x0,0);
    if (diff_match->schema == (lysc_node *)0x0) {
      plVar3 = (lys_module *)&diff_match[2].schema;
    }
    else {
      plVar3 = diff_match->schema->module;
    }
    ctx = plVar3->ctx;
    pcVar2 = lyd_diff_op2str(cur_op);
    LVar4 = LY_EINVAL;
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Unable to merge operation \"%s\" with \"%s\" for node \"%s\".",
           "none",pcVar2,__ptr);
    free(__ptr);
  }
  return LVar4;
}

Assistant:

static LY_ERR
lyd_diff_merge_none(struct lyd_node *diff_match, enum lyd_diff_op cur_op, const struct lyd_node *src_diff)
{
    switch (cur_op) {
    case LYD_DIFF_OP_NONE:
    case LYD_DIFF_OP_CREATE:
    case LYD_DIFF_OP_REPLACE:
        if (src_diff->schema->nodetype & LYD_NODE_TERM) {
            /* NONE on a term means only its dflt flag was changed */
            diff_match->flags &= ~LYD_DEFAULT;
            diff_match->flags |= src_diff->flags & LYD_DEFAULT;
        }
        break;
    default:
        /* delete operation is not valid */
        LOGERR_MERGEOP(LYD_CTX(diff_match), diff_match, cur_op, LYD_DIFF_OP_NONE);
        return LY_EINVAL;
    }

    return LY_SUCCESS;
}